

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

void __thiscall GlobOpt::Trace(GlobOpt *this,BasicBlock *block,bool before)

{
  uint uVar1;
  Type pJVar2;
  Type pBVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  JITTimeFunctionBody *pJVar14;
  FunctionJITTimeInfo *pFVar15;
  BasicBlock *pBVar16;
  BVSparse<Memory::JitArenaAllocator> *pBVar17;
  BVSparse<Memory::JitArenaAllocator> *pBVar18;
  undefined4 *puVar19;
  BVSparse<Memory::JitArenaAllocator> *pBVar20;
  char16_t *pcVar21;
  Type_conflict pBVar22;
  Type_conflict pBVar23;
  uint uVar24;
  
  pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar12 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
  pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,uVar12,uVar13);
  pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar12 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
  pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
  bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,TypeSpecPhase,uVar12,uVar13);
  pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar12 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
  pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
  bVar7 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,FloatTypeSpecPhase,uVar12,uVar13);
  pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar12 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
  pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
  bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,FieldCopyPropPhase,uVar12,uVar13);
  pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar12 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
  pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
  bVar9 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,ObjTypeSpecPhase,uVar12,uVar13);
  pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar12 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
  pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
  bVar10 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,ValueTablePhase,uVar12,uVar13);
  pJVar14 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar12 = JITTimeFunctionBody::GetSourceContextId(pJVar14);
  pFVar15 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar13 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar15);
  bVar11 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,FieldPREPhase,uVar12,uVar13);
  if (((((bVar9) || (bVar8)) || (bVar7)) || ((bVar6 || (bVar10)))) || ((bVar5 || (bVar11)))) {
    if (((bVar11) && (this->prePassLoop != (Loop *)0x0)) && (before && (block->field_0x18 & 4) != 0)
       ) {
      pBVar16 = Loop::GetHeadBlock(this->prePassLoop);
      Output::Print(L"====  Loop Prepass block header #%-3d,  Visiting Loop block head #%-3d\n",
                    (ulong)pBVar16->number,(ulong)block->number);
    }
    if (((bVar6 || bVar7) || bVar10) || (DAT_015bc46a == '\x01')) {
      if (before) {
        uVar24 = 0;
        Output::Print(L"========================================================================\n")
        ;
        Output::Print(L"Begin OptBlock: Block #%-3d",(ulong)block->number);
        if (block->loop != (Loop *)0x0) {
          pBVar16 = Loop::GetHeadBlock(block->loop);
          uVar1 = pBVar16->number;
          if (this->prePassLoop == (Loop *)0x0) {
            pcVar21 = L"";
          }
          else {
            pBVar16 = Loop::GetHeadBlock(this->prePassLoop);
            uVar24 = pBVar16->number;
            pcVar21 = L"PrePass";
            if (this->prePassLoop == (Loop *)0x0) {
              pcVar21 = L"";
            }
          }
          Output::Print(L"     Loop block header:%-3d  currentLoop block head:%-3d   %s",
                        (ulong)uVar1,(ulong)uVar24,pcVar21);
        }
        Output::Print(L"\n");
      }
      else {
        Output::Print(L"-----------------------------------------------------------------------\n");
        Output::Print(L"After OptBlock: Block #%-3d\n",(ulong)block->number);
      }
      if (bVar6 || bVar7) {
        pBVar20 = (block->globOptData).liveVarSyms;
        do {
          pBVar20 = (BVSparse<Memory::JitArenaAllocator> *)pBVar20->head;
          if (pBVar20 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0043a39c;
        } while (((Type *)&pBVar20->alloc)->word == 0);
        Output::Print(L"    Live var syms: ");
        BVSparse<Memory::JitArenaAllocator>::Dump((block->globOptData).liveVarSyms);
      }
LAB_0043a39c:
      if (bVar6) {
        pBVar20 = (block->globOptData).liveInt32Syms;
        pBVar17 = pBVar20;
        do {
          pBVar17 = (BVSparse<Memory::JitArenaAllocator> *)pBVar17->head;
          if (pBVar17 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0043a4da;
        } while (((Type *)&pBVar17->alloc)->word == 0);
        pBVar17 = this->tempBv;
        pBVar18 = pBVar17;
        do {
          pBVar18 = (BVSparse<Memory::JitArenaAllocator> *)pBVar18->head;
          if (pBVar18 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0043a438;
        } while (((Type *)&pBVar18->alloc)->word == 0);
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar19 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar19 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x4145,"(this->tempBv->IsEmpty())","this->tempBv->IsEmpty()");
        if (!bVar5) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar19 = 0;
        pBVar17 = this->tempBv;
        pBVar20 = (block->globOptData).liveInt32Syms;
LAB_0043a438:
        BVSparse<Memory::JitArenaAllocator>::Minus
                  (pBVar17,pBVar20,(block->globOptData).liveLossyInt32Syms);
        pBVar20 = this->tempBv;
        pBVar17 = pBVar20;
        do {
          pBVar17 = (BVSparse<Memory::JitArenaAllocator> *)pBVar17->head;
          if (pBVar17 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0043a475;
        } while (((Type *)&pBVar17->alloc)->word == 0);
        Output::Print(L"    Int32 type specialized (lossless) syms: ");
        BVSparse<Memory::JitArenaAllocator>::Dump(this->tempBv);
        pBVar20 = this->tempBv;
LAB_0043a475:
        if (pBVar20->head != (Type_conflict)0x0) {
          pJVar2 = pBVar20->alloc;
          pBVar3 = pBVar20->head;
          pBVar23 = pJVar2->bvFreeList;
          do {
            pBVar22 = pBVar3;
            pBVar3 = pBVar22->next;
            pBVar22->next = pBVar23;
            pBVar23 = pBVar22;
          } while (pBVar3 != (Type)0x0);
          pJVar2->bvFreeList = pBVar22;
        }
        pBVar20->head = (Type_conflict)0x0;
        pBVar20->lastFoundIndex = (Type_conflict)0x0;
        pBVar20->lastUsedNodePrevNextField = &pBVar20->head;
        pBVar20 = (block->globOptData).liveLossyInt32Syms;
        do {
          pBVar20 = (BVSparse<Memory::JitArenaAllocator> *)pBVar20->head;
          if (pBVar20 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0043a4da;
        } while (((Type *)&pBVar20->alloc)->word == 0);
        Output::Print(L"    Int32 converted (lossy) syms: ");
        BVSparse<Memory::JitArenaAllocator>::Dump((block->globOptData).liveLossyInt32Syms);
      }
LAB_0043a4da:
      if (bVar7) {
        pBVar20 = (block->globOptData).liveFloat64Syms;
        do {
          pBVar20 = (BVSparse<Memory::JitArenaAllocator> *)pBVar20->head;
          if (pBVar20 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0043a510;
        } while (((Type *)&pBVar20->alloc)->word == 0);
        Output::Print(L"    Float64 type specialized syms: ");
        BVSparse<Memory::JitArenaAllocator>::Dump((block->globOptData).liveFloat64Syms);
      }
LAB_0043a510:
      if ((bVar8 || bVar9) && (bVar5 = DoFieldCopyProp(this,block->loop), bVar5)) {
        pBVar20 = (block->globOptData).liveFields;
        do {
          pBVar20 = (BVSparse<Memory::JitArenaAllocator> *)pBVar20->head;
          if (pBVar20 == (BVSparse<Memory::JitArenaAllocator> *)0x0) goto LAB_0043a55a;
        } while (((Type *)&pBVar20->alloc)->word == 0);
        Output::Print(L"    Live field syms: ");
        BVSparse<Memory::JitArenaAllocator>::Dump((block->globOptData).liveFields);
      }
LAB_0043a55a:
      if (bVar9 || bVar10) {
        Output::Print(L"    Value table:\n");
        GlobOptBlockData::DumpSymToValueMap(&block->globOptData);
      }
      if (before) {
        Output::Print(L"-----------------------------------------------------------------------\n");
      }
      Output::Flush();
      return;
    }
  }
  return;
}

Assistant:

void
GlobOpt::Trace(BasicBlock * block, bool before) const
{
    bool globOptTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::GlobOptPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool typeSpecTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::TypeSpecPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool floatTypeSpecTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::FloatTypeSpecPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool fieldCopyPropTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::FieldCopyPropPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool objTypeSpecTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::ObjTypeSpecPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool valueTableTrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::ValueTablePhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());
    bool fieldPRETrace = Js::Configuration::Global.flags.Trace.IsEnabled(Js::FieldPREPhase, this->func->GetSourceContextId(), this->func->GetLocalFunctionId());

    bool anyTrace = globOptTrace || typeSpecTrace || floatTypeSpecTrace || fieldCopyPropTrace || objTypeSpecTrace || valueTableTrace || fieldPRETrace;

    if (!anyTrace)
    {
        return;
    }

    if (fieldPRETrace && this->IsLoopPrePass())
    {
        if (block->isLoopHeader && before)
        {
            Output::Print(_u("====  Loop Prepass block header #%-3d,  Visiting Loop block head #%-3d\n"),
                this->prePassLoop->GetHeadBlock()->GetBlockNum(), block->GetBlockNum());
        }
    }

    if (!typeSpecTrace && !floatTypeSpecTrace && !valueTableTrace && !Js::Configuration::Global.flags.Verbose)
    {
        return;
    }

    if (before)
    {
        Output::Print(_u("========================================================================\n"));
        Output::Print(_u("Begin OptBlock: Block #%-3d"), block->GetBlockNum());
        if (block->loop)
        {
            Output::Print(_u("     Loop block header:%-3d  currentLoop block head:%-3d   %s"),
                block->loop->GetHeadBlock()->GetBlockNum(),
                this->prePassLoop ? this->prePassLoop->GetHeadBlock()->GetBlockNum() : 0,
                this->IsLoopPrePass() ? _u("PrePass") : _u(""));
        }
        Output::Print(_u("\n"));
    }
    else
    {
        Output::Print(_u("-----------------------------------------------------------------------\n"));
        Output::Print(_u("After OptBlock: Block #%-3d\n"), block->GetBlockNum());
    }
    if ((typeSpecTrace || floatTypeSpecTrace) && !block->globOptData.liveVarSyms->IsEmpty())
    {
        Output::Print(_u("    Live var syms: "));
        block->globOptData.liveVarSyms->Dump();
    }
    if (typeSpecTrace && !block->globOptData.liveInt32Syms->IsEmpty())
    {
        Assert(this->tempBv->IsEmpty());
        this->tempBv->Minus(block->globOptData.liveInt32Syms, block->globOptData.liveLossyInt32Syms);
        if(!this->tempBv->IsEmpty())
        {
            Output::Print(_u("    Int32 type specialized (lossless) syms: "));
            this->tempBv->Dump();
        }
        this->tempBv->ClearAll();
        if(!block->globOptData.liveLossyInt32Syms->IsEmpty())
        {
            Output::Print(_u("    Int32 converted (lossy) syms: "));
            block->globOptData.liveLossyInt32Syms->Dump();
        }
    }
    if (floatTypeSpecTrace && !block->globOptData.liveFloat64Syms->IsEmpty())
    {
        Output::Print(_u("    Float64 type specialized syms: "));
        block->globOptData.liveFloat64Syms->Dump();
    }
    if ((fieldCopyPropTrace || objTypeSpecTrace) && this->DoFieldCopyProp(block->loop) && !block->globOptData.liveFields->IsEmpty())
    {
        Output::Print(_u("    Live field syms: "));
        block->globOptData.liveFields->Dump();
    }
    if (objTypeSpecTrace || valueTableTrace)
    {
        Output::Print(_u("    Value table:\n"));
        block->globOptData.DumpSymToValueMap();
    }

    if (before)
    {
        Output::Print(_u("-----------------------------------------------------------------------\n")); \
    }

    Output::Flush();
}